

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O2

char * CVmBif::get_str_val(vm_val_t *val)

{
  uint uVar1;
  char *pcVar2;
  
  if (val->typ == VM_OBJ) {
    uVar1 = (val->val).obj & 0xfff;
    pcVar2 = (char *)(**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar1].ptr_
                                 + 0x1a8))(G_obj_table_X.pages_[(val->val).obj >> 0xc] + uVar1);
    if (pcVar2 == (char *)0x0) goto LAB_00250f98;
  }
  else {
    if (val->typ != VM_SSTRING) {
LAB_00250f98:
      err_throw(0x7e3);
    }
    pcVar2 = G_const_pool_X.super_CVmPoolPaged.pages_
             [(val->val).obj >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].
             mem + (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & (val->val).obj);
  }
  return pcVar2;
}

Assistant:

const char *CVmBif::get_str_val(VMG_ const vm_val_t *val)
{
    CVmObject *obj;
    const char *p;

    /* see what we have */
    switch(val->typ)
    {
    case VM_SSTRING:
        /* it's a constant string - get the constant pool pointer */
        return G_const_pool->get_ptr(val->val.ofs);

    case VM_OBJ:
        /* get the object */
        obj = vm_objp(vmg_ val->val.obj);

        /* get the string value, if it has one */
        p = obj->get_as_string(vmg0_);

        /* if it has a string value, return it */
        if (p != 0)
            return p;

        /* we didn't get a string value */
        break;

    default:
        /* other types don't have a string value */
        break;
    }

    /* if we got here, the value isn't a string */
    err_throw(VMERR_STRING_VAL_REQD);
    AFTER_ERR_THROW(return 0;)
}